

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ES5ArrayTypeHandler.cpp
# Opt level: O1

void __thiscall Js::IndexPropertyDescriptorMap::EnsureIndexList(IndexPropertyDescriptorMap *this)

{
  Type *addr;
  int iVar1;
  int iVar2;
  BaseDictionary<unsigned_int,_Js::IndexPropertyDescriptor,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *pBVar3;
  code *pcVar4;
  bool bVar5;
  BOOL BVar6;
  Recycler *this_00;
  undefined4 *puVar7;
  size_t size;
  int iVar8;
  size_t __nmemb;
  uint *puVar9;
  size_t sVar10;
  undefined1 local_60 [8];
  TrackAllocData data;
  
  if ((this->indexList).ptr == (uint *)0x0) {
    pBVar3 = (this->indexPropertyMap).ptr;
    iVar1 = pBVar3->count;
    iVar2 = pBVar3->freeCount;
    iVar8 = iVar1 - iVar2;
    __nmemb = (size_t)iVar8;
    local_60 = (undefined1  [8])&unsigned_int::typeinfo;
    data.typeinfo = (type_info *)0x0;
    data.count = (size_t)anon_var_dwarf_9b91433;
    data.filename._0_4_ = 0x3a;
    data.plusSize = __nmemb;
    this_00 = Memory::Recycler::TrackAllocInfo(this->recycler,(TrackAllocData *)local_60);
    if (iVar1 == iVar2) {
      Memory::Recycler::ClearTrackAllocInfo(this_00,(TrackAllocData *)0x0);
      puVar9 = (uint *)&DAT_00000008;
    }
    else {
      size = 0xffffffffffffffff;
      if (-1 < iVar8) {
        size = __nmemb * 4;
      }
      BVar6 = ExceptionCheck::CanHandleOutOfMemory();
      if (BVar6 == 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        data._32_8_ = __tls_get_addr(&PTR_0155fe48);
        *(undefined4 *)data._32_8_ = 1;
        bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                    ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                                    "ExceptionCheck::CanHandleOutOfMemory()");
        if (!bVar5) goto LAB_00dc507f;
        *(undefined4 *)data._32_8_ = 0;
      }
      if (size == 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        data._32_8_ = __tls_get_addr(&PTR_0155fe48);
        *(undefined4 *)data._32_8_ = 1;
        bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                    ,0x1fc,"(byteSize != 0 || !TAllocator::FakeZeroLengthArray)",
                                    "byteSize != 0 || !TAllocator::FakeZeroLengthArray");
        if (!bVar5) goto LAB_00dc507f;
        *(undefined4 *)data._32_8_ = 0;
      }
      puVar9 = (uint *)Memory::Recycler::
                       AllocWithAttributesInlined<(Memory::ObjectInfoBits)32,false>(this_00,size);
      if (puVar9 == (uint *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar7 = 1;
        bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                    ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
        if (!bVar5) {
LAB_00dc507f:
          pcVar4 = (code *)invalidInstructionException();
          (*pcVar4)();
        }
        *puVar7 = 0;
      }
    }
    addr = &this->indexList;
    Memory::Recycler::WBSetBit((char *)addr);
    (this->indexList).ptr = puVar9;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(addr);
    this->lastIndexAt = -1;
    if (0 < iVar8) {
      sVar10 = 0;
      do {
        puVar9 = JsUtil::
                 BaseDictionary<unsigned_int,_Js::IndexPropertyDescriptor,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                 ::GetKeyAt((this->indexPropertyMap).ptr,(int)sVar10);
        (this->indexList).ptr[sVar10] = *puVar9;
        sVar10 = sVar10 + 1;
      } while (__nmemb != sVar10);
    }
    qsort(addr->ptr,__nmemb,4,CompareIndex);
  }
  return;
}

Assistant:

void IndexPropertyDescriptorMap::EnsureIndexList()
    {
        if (!indexList)
        {
            int length = Count();
            indexList = RecyclerNewArrayLeaf(recycler, uint32, length);
            lastIndexAt = -1; // Reset lastAccessorIndexAt

            for (int i = 0; i < length; i++)
            {
                indexList[i] = GetKeyAt(i);
            }

            ::qsort(indexList, length, sizeof(uint32), &CompareIndex);
        }
    }